

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_trimBack_completeString_fn(int _i)

{
  char *pcVar1;
  char *pcVar2;
  char **ppcVar3;
  int line;
  char *pcVar4;
  char *pcVar5;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x124573;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"        ",9);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x1245aa;
  AString_trimBack(&string,' ');
  if (string.capacity != 8) {
    uStack_50 = 0;
    local_58 = (char *)0x8;
    local_60 = "(8)";
    local_68 = (char *)string.capacity;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x272,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string).capacity == (8)",
                      "(string).capacity");
  }
  uStack_50 = 0x1245c8;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x272);
  if (string.buffer == (char *)0x0) {
    ppcVar3 = &local_58;
    pcVar2 = "Assertion \'_ck_x != NULL\' failed";
    pcVar1 = "Assertion \'%s\' failed: %s == %#x";
    pcVar4 = "(void*) (string).buffer != NULL";
    pcVar5 = "(void*) (string).buffer";
  }
  else {
    uStack_50 = 0x1245e5;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x272);
    if (string.buffer == (char *)0x0) {
      pcVar1 = "(null)";
      pcVar2 = "";
LAB_001246ec:
      uStack_50 = 0;
      local_58 = "\"";
      local_60 = "";
      local_68 = "\"";
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x272,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(string).buffer == (\"\")","(string).buffer",pcVar2,pcVar1,pcVar2,"(\"\")")
      ;
    }
    if (*string.buffer != '\0') {
      pcVar2 = "\"";
      pcVar1 = string.buffer;
      goto LAB_001246ec;
    }
    uStack_50 = 0x124615;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x272);
    if (string.size == 0) {
      uStack_50 = 0x124634;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x272);
      if (private_ACUtilsTest_AString_reallocCount == 0) {
        uStack_50 = 0x124655;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x273);
        uStack_50 = 0x12465e;
        (*string.deallocator)(string.buffer);
        return;
      }
      ppcVar3 = &local_68;
      local_60 = "(0)";
      local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
      pcVar2 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
      pcVar5 = "private_ACUtilsTest_AString_reallocCount";
      line = 0x273;
      goto LAB_001247c1;
    }
    ppcVar3 = &local_68;
    local_60 = "strlen(\"\")";
    local_68 = (char *)string.size;
    pcVar2 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(string).size == strlen(\"\")";
    pcVar5 = "(string).size";
  }
  line = 0x272;
LAB_001247c1:
  uStack_50 = 0;
  local_58 = (char *)0x0;
  *(code **)((long)ppcVar3 + -8) = test_AString_trimBack_nullptr_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,line,pcVar2,pcVar1,pcVar4,pcVar5);
}

Assistant:

static struct AString private_ACUtilsTest_AString_constructTestString(const char *initBuffer, size_t capacity)
{
    bool tmp = private_ACUtilsTest_AString_reallocFail;
    struct AString string = {private_ACUtilsTest_AString_realloc, private_ACUtilsTest_AString_free};
    string.size = strlen(initBuffer);
    string.capacity = capacity;
    private_ACUtilsTest_AString_reallocFail = false;
    string.buffer = (char*) string.reallocator(nullptr, string.capacity + 1);
    private_ACUtilsTest_AString_reallocFail = tmp;
    private_ACUtilsTest_AString_reallocCount = 0;
    private_ACUtilsTest_AString_freeCount = 0;
    memcpy(string.buffer, initBuffer, string.size + 1); /* +1 for '\0' */
    return string;
}